

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak_test.cc
# Opt level: O0

void KeccakFileTest(FileTest *t)

{
  pointer *ppuVar1;
  bool bVar2;
  char *pcVar3;
  uchar *puVar4;
  size_type sVar5;
  reference pvVar6;
  char *in_R9;
  AssertHelper local_b40;
  Message local_b38;
  Span<const_unsigned_char> local_b30;
  Bytes local_b20;
  Span<const_unsigned_char> local_b10;
  Bytes local_b00;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_7;
  size_t i_3;
  size_t i_2;
  Message local_ac8;
  Span<const_unsigned_char> local_ac0;
  Bytes local_ab0;
  Span<const_unsigned_char> local_aa0;
  Bytes local_a90;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_6;
  size_t i_1;
  size_t i;
  Message local_a58;
  Span<const_unsigned_char> local_a50;
  Bytes local_a40;
  Span<const_unsigned_char> local_a30;
  Bytes local_a20;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_5;
  Message local_9f8;
  Span<const_unsigned_char> local_9f0;
  Bytes local_9e0;
  Span<const_unsigned_char> local_9d0;
  Bytes local_9c0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_4;
  BORINGSSL_keccak_st ctx;
  Message local_8b0;
  Span<const_unsigned_char> local_8a8;
  Bytes local_898;
  Span<const_unsigned_char> local_888;
  Bytes local_878;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_3;
  Message local_850;
  Span<const_unsigned_char> local_848;
  Bytes local_838;
  Span<const_unsigned_char> local_828;
  Bytes local_818;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_2;
  Message local_7f0;
  Span<const_unsigned_char> local_7e8;
  Bytes local_7d8;
  Span<const_unsigned_char> local_7c8;
  Bytes local_7b8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_1;
  Message local_790;
  Span<const_unsigned_char> local_788;
  Bytes local_778;
  Span<const_unsigned_char> local_768;
  Bytes local_758;
  undefined1 local_748 [8];
  AssertionResult gtest_ar;
  uint8_t shake256_output [512];
  uint8_t shake128_output [512];
  uint8_t sha3_512_digest [64];
  uint8_t sha3_256_digest [32];
  string local_2d0;
  AssertHelper local_2b0;
  Message local_2a8;
  allocator<char> local_299;
  string local_298;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_240;
  Message local_238;
  allocator<char> local_229;
  string local_228;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1d0;
  Message local_1c8;
  allocator<char> local_1b9;
  string local_1b8;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_160;
  Message local_158;
  allocator<char> local_149;
  string local_148;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  string local_108;
  AssertHelper local_e8;
  Message local_e0 [3];
  allocator<char> local_c1;
  string local_c0;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake256_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake128_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_512_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_256_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  FileTest *t_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Input",&local_c1);
  local_99 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &sha3_256_expected.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_98,(AssertionResult *)"t->GetBytes(&input, \"Input\")",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(local_e0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"SHA3-256",&local_149);
    local_121 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &sha3_512_expected.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_120,&local_121,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar2) {
      testing::Message::Message(&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_120,
                 (AssertionResult *)"t->GetBytes(&sha3_256_expected, \"SHA3-256\")","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x20,pcVar3);
      testing::internal::AssertHelper::operator=(&local_160,&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_158);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"SHA3-512",&local_1b9)
      ;
      local_191 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &shake128_expected.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_1b8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_190,&local_191,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar2) {
        testing::Message::Message(&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_190,
                   (AssertionResult *)"t->GetBytes(&sha3_512_expected, \"SHA3-512\")","false","true"
                   ,in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                   ,0x21,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_1c8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"SHAKE-128",&local_229);
        local_201 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &shake256_expected.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       &local_228);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_200,&local_201,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
        if (!bVar2) {
          testing::Message::Message(&local_238);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_200,
                     (AssertionResult *)"t->GetBytes(&shake128_expected, \"SHAKE-128\")","false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_240,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                     ,0x22,pcVar3);
          testing::internal::AssertHelper::operator=(&local_240,&local_238);
          testing::internal::AssertHelper::~AssertHelper(&local_240);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_238);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"SHAKE-256",&local_299);
          local_271 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &gtest_ar_.message_,&local_298);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_270,&local_271,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator(&local_299);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar2) {
            testing::Message::Message(&local_2a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_2d0,(internal *)local_270,
                       (AssertionResult *)"t->GetBytes(&shake256_expected, \"SHAKE-256\")","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                       ,0x23,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper(&local_2b0);
            std::__cxx11::string::~string((string *)&local_2d0);
            testing::Message::~Message(&local_2a8);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak(sha3_512_digest + 0x38,0x20,puVar4,sVar5,boringssl_sha3_256);
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak(shake128_output + 0x1f8,0x40,puVar4,sVar5,boringssl_sha3_512);
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak(shake256_output + 0x1f8,0x200,puVar4,sVar5,boringssl_shake128);
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak((uint8_t *)&gtest_ar.message_,0x200,puVar4,sVar5,boringssl_shake256);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_768,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &sha3_512_expected.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            Bytes::Bytes(&local_758,local_768);
            bssl::Span<unsigned_char_const>::Span<32ul>
                      ((Span<unsigned_char_const> *)&local_788,
                       (uchar (*) [32])(sha3_512_digest + 0x38));
            Bytes::Bytes(&local_778,local_788);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_748,"Bytes(sha3_256_expected)","Bytes(sha3_256_digest)",
                       &local_758,&local_778);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
            if (!bVar2) {
              testing::Message::Message(&local_790);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x32,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1.message_,&local_790);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_790);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_7c8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &shake128_expected.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            Bytes::Bytes(&local_7b8,local_7c8);
            bssl::Span<unsigned_char_const>::Span<64ul>
                      ((Span<unsigned_char_const> *)&local_7e8,
                       (uchar (*) [64])(shake128_output + 0x1f8));
            Bytes::Bytes(&local_7d8,local_7e8);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_7a8,"Bytes(sha3_512_expected)","Bytes(sha3_512_digest)",
                       &local_7b8,&local_7d8);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
            if (!bVar2) {
              testing::Message::Message(&local_7f0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x33,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_2.message_,&local_7f0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_7f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_828,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &shake256_expected.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            Bytes::Bytes(&local_818,local_828);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_848,
                       (uchar (*) [512])(shake256_output + 0x1f8));
            Bytes::Bytes(&local_838,local_848);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_808,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       &local_818,&local_838);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
            if (!bVar2) {
              testing::Message::Message(&local_850);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x34,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_3.message_,&local_850);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_850);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_888,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_878,local_888);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_8a8,(uchar (*) [512])&gtest_ar.message_);
            Bytes::Bytes(&local_898,local_8a8);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_868,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       &local_878,&local_898);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
            if (!bVar2) {
              testing::Message::Message(&local_8b0);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&ctx.squeeze_offset,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x35,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&ctx.squeeze_offset,&local_8b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx.squeeze_offset);
              testing::Message::~Message(&local_8b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
            OPENSSL_memset(shake256_output + 0x1f8,0,0x200);
            BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&gtest_ar_4.message_,boringssl_shake128);
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak_absorb((BORINGSSL_keccak_st *)&gtest_ar_4.message_,puVar4,sVar5);
            BORINGSSL_keccak_squeeze
                      ((BORINGSSL_keccak_st *)&gtest_ar_4.message_,shake256_output + 0x1f8,0x200);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_9d0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &shake256_expected.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            Bytes::Bytes(&local_9c0,local_9d0);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_9f0,
                       (uchar (*) [512])(shake256_output + 0x1f8));
            Bytes::Bytes(&local_9e0,local_9f0);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_9b0,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       &local_9c0,&local_9e0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
            if (!bVar2) {
              testing::Message::Message(&local_9f8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x3e,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_9f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_9f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
            OPENSSL_memset(&gtest_ar.message_,0,0x200);
            BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&gtest_ar_4.message_,boringssl_shake256);
            ppuVar1 = &sha3_256_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            BORINGSSL_keccak_absorb((BORINGSSL_keccak_st *)&gtest_ar_4.message_,puVar4,sVar5);
            BORINGSSL_keccak_squeeze
                      ((BORINGSSL_keccak_st *)&gtest_ar_4.message_,(uint8_t *)&gtest_ar.message_,
                       0x200);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_a30,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_a20,local_a30);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_a50,(uchar (*) [512])&gtest_ar.message_);
            Bytes::Bytes(&local_a40,local_a50);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_a10,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       &local_a20,&local_a40);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
            if (!bVar2) {
              testing::Message::Message(&local_a58);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&i,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x44,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_a58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
              testing::Message::~Message(&local_a58);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
            OPENSSL_memset(shake256_output + 0x1f8,0,0x200);
            BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&gtest_ar_4.message_,boringssl_shake128);
            for (i_1 = 0; sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sha3_256_expected.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                , i_1 < sVar5; i_1 = i_1 + 1) {
              pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &sha3_256_expected.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,i_1);
              BORINGSSL_keccak_absorb((BORINGSSL_keccak_st *)&gtest_ar_4.message_,pvVar6,1);
            }
            for (gtest_ar_6.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl =
                      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0;
                (ulong)gtest_ar_6.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl < 0x200;
                gtest_ar_6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )((long)gtest_ar_6.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1)) {
              BORINGSSL_keccak_squeeze
                        ((BORINGSSL_keccak_st *)&gtest_ar_4.message_,
                         shake256_output +
                         (long)gtest_ar_6.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x1f8,1);
            }
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_aa0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &shake256_expected.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            Bytes::Bytes(&local_a90,local_aa0);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_ac0,
                       (uchar (*) [512])(shake256_output + 0x1f8));
            Bytes::Bytes(&local_ab0,local_ac0);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_a80,"Bytes(shake128_expected)","Bytes(shake128_output)",
                       &local_a90,&local_ab0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
            if (!bVar2) {
              testing::Message::Message(&local_ac8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&i_2,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x4f,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_ac8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
              testing::Message::~Message(&local_ac8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
            OPENSSL_memset(&gtest_ar.message_,0,0x200);
            BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&gtest_ar_4.message_,boringssl_shake256);
            for (i_3 = 0; sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&sha3_256_expected.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                , i_3 < sVar5; i_3 = i_3 + 1) {
              pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &sha3_256_expected.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,i_3);
              BORINGSSL_keccak_absorb((BORINGSSL_keccak_st *)&gtest_ar_4.message_,pvVar6,1);
            }
            for (gtest_ar_7.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl =
                      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0;
                (ulong)gtest_ar_7.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl < 0x200;
                gtest_ar_7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )((long)gtest_ar_7.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1)) {
              BORINGSSL_keccak_squeeze
                        ((BORINGSSL_keccak_st *)&gtest_ar_4.message_,
                         shake256_output +
                         (long)gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + -8,1);
            }
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_b10,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_b00,local_b10);
            bssl::Span<unsigned_char_const>::Span<512ul>
                      ((Span<unsigned_char_const> *)&local_b30,(uchar (*) [512])&gtest_ar.message_);
            Bytes::Bytes(&local_b20,local_b30);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_af0,"Bytes(shake256_expected)","Bytes(shake256_output)",
                       &local_b00,&local_b20);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
            if (!bVar2) {
              testing::Message::Message(&local_b38);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                         ,0x59,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b40,&local_b38);
              testing::internal::AssertHelper::~AssertHelper(&local_b40);
              testing::Message::~Message(&local_b38);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shake256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shake128_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sha3_512_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sha3_256_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void KeccakFileTest(FileTest *t) {
  std::vector<uint8_t> input, sha3_256_expected, sha3_512_expected,
      shake128_expected, shake256_expected;
  ASSERT_TRUE(t->GetBytes(&input, "Input"));
  ASSERT_TRUE(t->GetBytes(&sha3_256_expected, "SHA3-256"));
  ASSERT_TRUE(t->GetBytes(&sha3_512_expected, "SHA3-512"));
  ASSERT_TRUE(t->GetBytes(&shake128_expected, "SHAKE-128"));
  ASSERT_TRUE(t->GetBytes(&shake256_expected, "SHAKE-256"));

  uint8_t sha3_256_digest[32];
  BORINGSSL_keccak(sha3_256_digest, sizeof(sha3_256_digest), input.data(),
                   input.size(), boringssl_sha3_256);
  uint8_t sha3_512_digest[64];
  BORINGSSL_keccak(sha3_512_digest, sizeof(sha3_512_digest), input.data(),
                   input.size(), boringssl_sha3_512);
  uint8_t shake128_output[512];
  BORINGSSL_keccak(shake128_output, sizeof(shake128_output), input.data(),
                   input.size(), boringssl_shake128);
  uint8_t shake256_output[512];
  BORINGSSL_keccak(shake256_output, sizeof(shake256_output), input.data(),
                   input.size(), boringssl_shake256);

  EXPECT_EQ(Bytes(sha3_256_expected), Bytes(sha3_256_digest));
  EXPECT_EQ(Bytes(sha3_512_expected), Bytes(sha3_512_digest));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  struct BORINGSSL_keccak_st ctx;

  // Single-pass absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake128_output, sizeof(shake128_output));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake256_output, sizeof(shake256_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  // Byte-by-byte absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake128_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake128_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake256_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake256_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));
}